

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::MockConnectionReceiver>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::MockConnectionReceiver> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    ArrayBuilder<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest>::dispose
              ((ArrayBuilder<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest> *)
               ((long)pointer + 0x20));
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)((long)pointer + 0x10));
    AsyncObject::~AsyncObject((AsyncObject *)pointer);
  }
  operator_delete(pointer,0x40);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }